

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyInstance.cpp
# Opt level: O1

Var Js::WebAssemblyInstance::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  WebAssemblyModule *module;
  RecyclableObject *importObject;
  WebAssemblyInstance *pWVar7;
  int in_stack_00000010;
  Arguments local_48;
  CallInfo local_38;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_38 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_38._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyInstance.cpp"
                                ,0x33,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d9a7c9;
    *puVar5 = 0;
  }
  callInfo_local = local_38;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_38);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyInstance.cpp"
                                ,0x36,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar3) {
LAB_00d9a7c9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pvVar6 = CallInfo::GetNewTarget
                     ((uint)callInfo_local._0_4_ >> 0x18,(Var *)&stack0x00000018,
                      callInfo_local._0_4_ & 0xffffff);
  local_48.Info = callInfo_local;
  local_48.Values = (Type)&stack0x00000018;
  JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_48);
  if (((ulong)callInfo_local & 0x1000000) != 0) {
    if (pvVar6 != (Var)0x0) {
      BVar4 = JavascriptOperators::IsUndefinedObject(pvVar6);
      if (BVar4 != 0) goto LAB_00d9a7b5;
    }
    if (((ulong)callInfo_local & 0xfffffe) != 0) {
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      bVar3 = VarIs<Js::WebAssemblyModule>(pvVar6);
      if (bVar3) {
        pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
        module = VarTo<Js::WebAssemblyModule>(pvVar6);
        if ((callInfo_local._0_4_ & 0xffffff) < 3) {
          importObject = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                         super_JavascriptLibraryBase).undefinedValue.ptr;
        }
        else {
          importObject = (RecyclableObject *)Arguments::operator[]((Arguments *)&callInfo_local,2);
        }
        pWVar7 = CreateInstance(module,importObject);
        return pWVar7;
      }
    }
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5e4a5,(PCWSTR)0x0);
  }
LAB_00d9a7b5:
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ea00,L"WebAssembly.Instance");
}

Assistant:

Var
WebAssemblyInstance::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

    Var newTarget = args.GetNewTarget();
    JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

    if (!args.IsNewCall() || (newTarget && JavascriptOperators::IsUndefinedObject(newTarget)))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew, _u("WebAssembly.Instance"));
    }

    if (args.Info.Count < 2 || !VarIs<WebAssemblyModule>(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedModule);
    }
    WebAssemblyModule * module = VarTo<WebAssemblyModule>(args[1]);

    Var importObject = scriptContext->GetLibrary()->GetUndefined();
    if (args.Info.Count >= 3)
    {
        importObject = args[2];
    }

    return CreateInstance(module, importObject);
}